

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

bool __thiscall
soul::heart::Parser::parseStatement(Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  Expression *pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char (*args_00) [2];
  AssignmentTarget local_208;
  undefined1 local_1d8 [8];
  string newVariableName;
  AssignmentTarget local_1b0;
  CompileMessage local_180;
  undefined1 local_148 [8];
  pool_ptr<soul::heart::Expression> existingVariableTarget;
  string local_138 [32];
  bool local_118;
  bool local_117;
  CodeLocation local_110;
  CompileMessage local_100;
  AssignmentTarget local_c8;
  CompileMessage local_98;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  string name;
  FunctionBuilder *builder_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  name.field_2._8_8_ = builder;
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"let");
  if (bVar2) {
    readVariableIdentifier_abi_cxx11_((string *)local_48,this);
    findVariable((Parser *)local_50,(FunctionParseState *)this,(string *)state);
    bVar2 = pool_ptr<soul::heart::Variable>::operator!=
                      ((pool_ptr<soul::heart::Variable> *)local_50,(void *)0x0);
    pool_ptr<soul::heart::Variable>::~pool_ptr((pool_ptr<soul::heart::Variable> *)local_50);
    if (bVar2) {
      Errors::nameInUse<std::__cxx11::string&>(&local_98,(Errors *)local_48,args);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_98);
      CompileMessage::~CompileMessage(&local_98);
    }
    uVar1 = name.field_2._8_8_;
    pool_ptr<soul::heart::Expression>::pool_ptr(&local_c8.existingVariable,(void *)0x0);
    std::__cxx11::string::string((string *)&local_c8.newVariableName,(string *)local_48);
    local_c8.isConst = true;
    local_c8.isNull = false;
    parseVariableAssignment(this,state,(FunctionBuilder *)uVar1,&local_c8);
    AssignmentTarget::~AssignmentTarget(&local_c8);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"write");
    if (bVar2) {
      this_local._7_1_ = parseWriteStream(this,state,(FunctionBuilder *)name.field_2._8_8_);
    }
    else {
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"advance");
      if (bVar2) {
        bVar2 = FunctionType::isRun(&state->function->functionType);
        if (!bVar2) {
          Errors::advanceCannotBeCalledHere<>();
          CodeLocation::throwError
                    (&(this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ).location,&local_100);
        }
        expectSemicolon(this);
        uVar1 = name.field_2._8_8_;
        CodeLocation::CodeLocation
                  (&local_110,
                   &(this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).location);
        FunctionBuilder::addAdvance((FunctionBuilder *)uVar1,&local_110);
        CodeLocation::~CodeLocation(&local_110);
        this_local._7_1_ = 1;
      }
      else {
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                ::matchIf<char_const*>
                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            *)this,"call");
        uVar1 = name.field_2._8_8_;
        if (bVar2) {
          pool_ptr<soul::heart::Expression>::pool_ptr(&existingVariableTarget,(void *)0x0);
          std::__cxx11::string::string(local_138);
          local_118 = false;
          local_117 = true;
          parseFunctionCall(this,state,(FunctionBuilder *)uVar1,
                            (AssignmentTarget *)&existingVariableTarget);
          AssignmentTarget::~AssignmentTarget((AssignmentTarget *)&existingVariableTarget);
          this_local._7_1_ = 1;
        }
        else {
          bVar2 = matchesAnyIdentifier(this);
          if (bVar2) {
            parseVariableExpression((Parser *)local_148,(FunctionParseState *)this);
            bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_148);
            if (bVar2) {
              pEVar4 = pool_ptr<soul::heart::Expression>::operator->
                                 ((pool_ptr<soul::heart::Expression> *)local_148);
              uVar3 = (*(pEVar4->super_Object)._vptr_Object[8])();
              uVar1 = name.field_2._8_8_;
              if ((uVar3 & 1) == 0) {
                Errors::operatorNeedsAssignableTarget<char_const(&)[2]>
                          (&local_180,(Errors *)0x4aecb7,args_00);
                CodeLocation::throwError
                          (&(this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ).location,&local_180);
              }
              local_1b0.existingVariable.object = (Expression *)local_148;
              std::__cxx11::string::string((string *)&local_1b0.newVariableName);
              local_1b0.isConst = false;
              local_1b0.isNull = false;
              parseVariableAssignment(this,state,(FunctionBuilder *)uVar1,&local_1b0);
              AssignmentTarget::~AssignmentTarget(&local_1b0);
              this_local._7_1_ = 1;
              newVariableName.field_2._12_4_ = 1;
            }
            else {
              newVariableName.field_2._12_4_ = 0;
            }
            pool_ptr<soul::heart::Expression>::~pool_ptr
                      ((pool_ptr<soul::heart::Expression> *)local_148);
            if (newVariableName.field_2._12_4_ == 0) {
              readVariableIdentifier_abi_cxx11_((string *)local_1d8,this);
              uVar1 = name.field_2._8_8_;
              pool_ptr<soul::heart::Expression>::pool_ptr(&local_208.existingVariable,(void *)0x0);
              std::__cxx11::string::string((string *)&local_208.newVariableName,(string *)local_1d8)
              ;
              local_208.isConst = false;
              local_208.isNull = false;
              parseVariableAssignment(this,state,(FunctionBuilder *)uVar1,&local_208);
              AssignmentTarget::~AssignmentTarget(&local_208);
              this_local._7_1_ = 1;
              newVariableName.field_2._12_4_ = 1;
              std::__cxx11::string::~string((string *)local_1d8);
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool parseStatement (FunctionParseState& state, FunctionBuilder& builder)
    {
        if (matchIf ("let"))
        {
            auto name = readVariableIdentifier();

            if (findVariable (state, name) != nullptr)
                throwError (Errors::nameInUse (name));

            parseVariableAssignment (state, builder, { nullptr, name, true, false });
            return true;
        }

        if (matchIf ("write"))
            return parseWriteStream (state, builder);

        if (matchIf ("advance"))
        {
            if (! state.function.functionType.isRun())
                location.throwError (Errors::advanceCannotBeCalledHere());

            expectSemicolon();
            builder.addAdvance (location);
            return true;
        }

        if (matchIf ("call"))
        {
            parseFunctionCall (state, builder, { nullptr, {}, false, true });
            return true;
        }

        if (matchesAnyIdentifier())
        {
            if (auto existingVariableTarget = parseVariableExpression (state))
            {
                if (! existingVariableTarget->isMutable())
                    location.throwError (Errors::operatorNeedsAssignableTarget ("="));

                parseVariableAssignment (state, builder, { existingVariableTarget, {}, false, false });
                return true;
            }

            auto newVariableName = readVariableIdentifier();
            parseVariableAssignment (state, builder, { nullptr, newVariableName, false, false });
            return true;
        }

        return false;
    }